

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cl_parser.cxx
# Opt level: O3

bool __thiscall cl_parser::parse(cl_parser *this,int argc,char **argv,int optc,option_desc *optv)

{
  option_type oVar1;
  char *__s1;
  char *__s2;
  undefined1 auVar2 [16];
  int iVar3;
  option *poVar4;
  long lVar5;
  option_type *poVar6;
  ulong uVar7;
  char **ppcVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)argc;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
  }
  poVar4 = (option *)operator_new__(uVar7);
  this->m_options = poVar4;
  this->m_argc = (ulong)(argc & 0x7fffffff);
  if (argc < 2) {
    sVar10 = 0;
  }
  else {
    lVar5 = (ulong)(argc & 0x7fffffff) - 1;
    sVar9 = 0;
    do {
      ppcVar8 = argv + 1;
      __s1 = argv[1];
      iVar12 = argc;
      if (*__s1 == '-') {
        poVar6 = &optv->type;
        iVar11 = optc + 1;
        if (optc < 1) {
          return false;
        }
        while( true ) {
          __s2 = ((option_desc *)(poVar6 + -2))->name;
          iVar3 = strcmp(__s1,__s2);
          if (iVar3 == 0) break;
          iVar11 = iVar11 + -1;
          poVar6 = poVar6 + 4;
          if (iVar11 < 2) {
            return false;
          }
        }
        sVar10 = sVar9 + 1;
        poVar4 = this->m_options + sVar9;
        poVar4->name = __s2;
        oVar1 = *poVar6;
        poVar4->type = oVar1;
        if (oVar1 == OT_BOOL) {
          (poVar4->field_2).v_bool = true;
        }
        else {
          if (argc == 2) {
            return false;
          }
          iVar12 = argc + -1;
          ppcVar8 = argv + 2;
          if (oVar1 == OT_INTEGER) {
            iVar11 = atoi(*ppcVar8);
            (poVar4->field_2).v_integer = iVar11;
          }
          else if (oVar1 == OT_FLOAT) {
            dVar13 = atof(*ppcVar8);
            (poVar4->field_2).v_float = (float)dVar13;
          }
          else {
            if (oVar1 != OT_STRING) {
              return false;
            }
            (poVar4->field_2).v_string = *ppcVar8;
          }
        }
      }
      else {
        this->m_options[lVar5].name = __s1;
        lVar5 = lVar5 + -1;
        this->m_num_params = this->m_num_params + 1;
        sVar10 = sVar9;
      }
      argc = iVar12 + -1;
      sVar9 = sVar10;
      argv = ppcVar8;
    } while (2 < iVar12);
  }
  this->m_num_options = sVar10;
  return true;
}

Assistant:

bool cl_parser::parse(int argc, const char* const argv[],
		int optc, const option_desc* optv)
{
	m_options = new option[argc];
	m_argc = size_t(argc & INT_MAX);

	size_t opt_idx = 0, param_idx = size_t(argc & INT_MAX) - 1;
	for (++argv; argc > 1; ++argv, --argc) {
		if ((*argv)[0] != '-') {
			m_options[param_idx].name = *argv;
			--param_idx;
			++m_num_params;
			continue;
		}
		bool valid = false;
		const option_desc* desc = optv;
		for (int j = optc; j > 0; --j, ++desc) {
			if (std::strcmp(*argv, desc->name) != 0)
				continue;
			valid = true;
			option& opt = m_options[opt_idx++];
			opt.name = desc->name;
			opt.type = desc->type;
			if (opt.type == OT_BOOL) {
				opt.v_bool = true;
			} else if (--argc <= 1) {
				return false;
			} else {
				++argv;
				switch (opt.type) {
				case OT_STRING:
					opt.v_string = *argv;
					break;
				case OT_INTEGER:
					opt.v_integer = std::atoi(*argv);
					break;
				case OT_FLOAT:
					opt.v_float = float(std::atof(*argv));
					break;
				default:
					return false;
				}
			}
			break;
		}
		if (!valid)
			return false;
	}
	m_num_options = opt_idx;
	return true;
}